

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_scene_glows.cxx
# Opt level: O2

void __thiscall xray_re::xr_glow_object::save_v12(xr_glow_object *this,xr_ini_writer *w)

{
  size_t in_RCX;
  size_t __n;
  void *__buf;
  string asStack_58 [32];
  string local_38 [32];
  
  xr_custom_object::save_v12(&this->super_xr_custom_object,w);
  xr_ini_writer::write(w,0x1d3f45,(void *)0x12,in_RCX);
  xr_ini_writer::write(w,0x1d2c59,__buf,in_RCX);
  std::__cxx11::string::string(local_38,(string *)&this->m_shader);
  xr_ini_writer::write(w,0x1d1968,local_38,0);
  std::__cxx11::string::~string(local_38);
  std::__cxx11::string::string(asStack_58,(string *)&this->m_texture);
  __n = 0;
  xr_ini_writer::write(w,0x1d1974,asStack_58,0);
  std::__cxx11::string::~string(asStack_58);
  xr_ini_writer::write(w,0x1c66ca,(void *)(ulong)this->m_flags,__n);
  return;
}

Assistant:

void xr_glow_object::save_v12(xr_ini_writer* w) const
{
	xr_custom_object::save_v12(w);

	w->write("version", GLOW_VERSION);
	w->write("radius", m_radius);
	w->write("shader_name", m_shader, false);
	w->write("texture_name", m_texture, false);

	w->write("flags", m_flags);
}